

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_bool j2k_encode(opj_j2k_t *j2k,opj_cio_t *cio,opj_image_t *image,
                   opj_codestream_info_t *cstr_info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  opj_tcd_t *poVar6;
  undefined8 *in_RCX;
  int *in_RDX;
  opj_cio_t *in_RSI;
  undefined8 *in_RDI;
  int tot_num_tp;
  opj_tcp_t *tcp_1;
  int acc_pack_num;
  int tilepartno;
  int pino;
  opj_tcp_t *tcp;
  int compno_1;
  opj_tcd_t *tcd;
  opj_cp_t *cp;
  int compno;
  int tileno;
  int in_stack_000000cc;
  opj_cp_t *in_stack_000000d0;
  opj_image_t *in_stack_000000d8;
  opj_tcd_t *in_stack_000000e0;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  opj_j2k_t *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  int iVar7;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar8;
  undefined4 in_stack_ffffffffffffffb4;
  long in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  opj_image_t *image_00;
  opj_j2k_t *j2k_00;
  uint uVar9;
  undefined4 in_stack_ffffffffffffffdc;
  
  image_00 = (opj_image_t *)0x0;
  in_RDI[0xe] = in_RSI;
  in_RDI[0xb] = in_RDX;
  j2k_00 = (opj_j2k_t *)in_RDI[0xc];
  in_RDI[0xd] = in_RCX;
  if (in_RCX != (undefined8 *)0x0) {
    pvVar5 = malloc((long)(*(int *)&j2k_00->tile_len * *(int *)((long)&j2k_00->tile_len + 4)) *
                    0x260);
    in_RCX[0xd] = pvVar5;
    *(int *)(in_RCX + 2) = in_RDX[2] - *in_RDX;
    *(int *)((long)in_RCX + 0x14) = in_RDX[3] - in_RDX[1];
    *(undefined4 *)(in_RCX + 3) = *(undefined4 *)(*(long *)&j2k_00[1].state + 8);
    *(undefined4 *)((long)in_RCX + 0x2c) = *(undefined4 *)&j2k_00->tile_len;
    *(undefined4 *)(in_RCX + 6) = *(undefined4 *)((long)&j2k_00->tile_len + 4);
    *(int *)((long)in_RCX + 0x1c) = j2k_00->pos_correction;
    *(undefined4 *)(in_RCX + 4) = *(undefined4 *)&j2k_00->field_0x3c;
    *(int *)((long)in_RCX + 0x24) = j2k_00->sot_start;
    *(int *)(in_RCX + 5) = j2k_00->sod_start;
    *(int *)((long)in_RCX + 0x34) = in_RDX[4];
    *(undefined4 *)(in_RCX + 7) = *(undefined4 *)(*(long *)&j2k_00[1].state + 0xc);
    pvVar5 = malloc((ulong)(uint)in_RDX[4] << 2);
    in_RCX[8] = pvVar5;
    for (in_stack_ffffffffffffffc4 = 0; in_stack_ffffffffffffffc4 < (uint)in_RDX[4];
        in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1) {
      *(int *)(in_RCX[8] + (long)(int)in_stack_ffffffffffffffc4 * 4) =
           *(int *)(*(long *)(*(long *)&j2k_00[1].state + 0x15e0) + 4) + -1;
    }
    *in_RCX = 0;
    iVar1 = cio_tell(in_RSI);
    *(int *)((long)in_RCX + 0x5c) = iVar1;
    *(undefined4 *)(in_RCX + 0xb) = 100;
    pvVar5 = malloc((long)*(int *)(in_RCX + 0xb) * 0x18);
    in_RCX[10] = pvVar5;
    *(undefined4 *)(in_RCX + 9) = 0;
  }
  j2k_write_soc(in_stack_ffffffffffffffa0);
  j2k_write_siz((opj_j2k_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  j2k_write_cod((opj_j2k_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  j2k_write_qcd(in_stack_ffffffffffffffa0);
  if (*(int *)&j2k_00->cinfo != 0) {
    for (uVar9 = 1; uVar9 < (uint)in_RDX[4]; uVar9 = uVar9 + 1) {
      j2k_write_coc((opj_j2k_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      j2k_write_qcc((opj_j2k_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffac);
    }
  }
  for (uVar9 = 0; uVar9 < (uint)in_RDX[4]; uVar9 = uVar9 + 1) {
    in_stack_ffffffffffffffb8 = *(long *)&j2k_00[1].state;
    if (*(int *)(*(long *)(in_stack_ffffffffffffffb8 + 0x15e0) + (long)(int)uVar9 * 0x438 + 0x328)
        != 0) {
      j2k_write_rgn((opj_j2k_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(int)in_stack_ffffffffffffffb8);
    }
  }
  if (j2k_00->tile_data != (uchar **)0x0) {
    j2k_write_com((opj_j2k_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  iVar1 = j2k_calculate_tp((opj_cp_t *)CONCAT44(in_stack_ffffffffffffffdc,uVar9),
                           (int)((ulong)j2k_00 >> 0x20),image_00,
                           (opj_j2k_t *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  *(int *)((long)in_RDI + 0x24) = iVar1;
  if ((*(int *)&j2k_00->cinfo != 0) &&
     (j2k_write_tlm(in_stack_ffffffffffffffa0), *(int *)&j2k_00->cinfo == 3)) {
    j2k_write_poc(j2k_00);
  }
  if (in_RCX != (undefined8 *)0x0) {
    iVar1 = cio_tell(in_RSI);
    *(int *)(in_RCX + 0xc) = iVar1 + -1;
  }
  poVar6 = tcd_create((opj_common_ptr)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
  ;
  for (iVar1 = 0; iVar1 < *(int *)&j2k_00->tile_len * *(int *)((long)&j2k_00->tile_len + 4);
      iVar1 = iVar1 + 1) {
    iVar7 = 0;
    in_stack_ffffffffffffffa0 = (opj_j2k_t *)(*(long *)&j2k_00[1].state + (long)iVar1 * 0x15e8);
    opj_event_msg((opj_common_ptr)*in_RDI,4,"tile number %d / %d\n",(ulong)(iVar1 + 1),
                  (ulong)(uint)(*(int *)&j2k_00->tile_len * *(int *)((long)&j2k_00->tile_len + 4)));
    *(int *)((long)in_RDI + 0xc) = iVar1;
    *(undefined4 *)((long)in_RDI + 0x14) = 0;
    poVar6->cur_totnum_tp = *(int *)(in_RDI[3] + (long)*(int *)((long)in_RDI + 0xc) * 4);
    if (iVar1 == 0) {
      tcd_malloc_encode(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000cc);
    }
    else {
      tcd_init_encode(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000cc);
    }
    if (in_RCX != (undefined8 *)0x0) {
      iVar2 = cio_tell(in_RSI);
      *(int *)(in_RCX[0xd] + (long)*(int *)((long)in_RDI + 0xc) * 0x260 + 0xc) =
           iVar2 + *(int *)(in_RDI + 7);
      *(undefined4 *)(in_RCX[0xd] + (long)*(int *)((long)in_RDI + 0xc) * 0x260 + 0x250) = 10;
      pvVar5 = malloc((long)*(int *)(in_RCX[0xd] + (long)*(int *)((long)in_RDI + 0xc) * 0x260 +
                                    0x250) * 0x18);
      *(void **)(in_RCX[0xd] + (long)*(int *)((long)in_RDI + 0xc) * 0x260 + 0x248) = pvVar5;
      *(undefined4 *)(in_RCX[0xd] + (long)*(int *)((long)in_RDI + 0xc) * 0x260 + 0x240) = 0;
    }
    for (iVar2 = 0; iVar2 <= *(int *)&in_stack_ffffffffffffffa0[3].field_0x3c; iVar2 = iVar2 + 1) {
      poVar6->cur_pino = iVar2;
      iVar3 = j2k_get_num_tp((opj_cp_t *)
                             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                             (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                             (int)in_stack_ffffffffffffffb8);
      poVar6->tp_pos = j2k_00->cur_tp_num;
      for (iVar8 = 0; iVar8 < iVar3; iVar8 = iVar8 + 1) {
        *(int *)(in_RDI + 2) = iVar8;
        if (in_RCX != (undefined8 *)0x0) {
          iVar4 = cio_tell(in_RSI);
          *(int *)(*(long *)(in_RCX[0xd] + (long)*(int *)((long)in_RDI + 0xc) * 0x260 + 600) +
                  (long)*(int *)((long)in_RDI + 0x14) * 0x14) = iVar4 + *(int *)(in_RDI + 7);
        }
        j2k_write_sot(in_stack_ffffffffffffffa0);
        if ((*(int *)((long)in_RDI + 0x14) == 0) && (*(int *)&j2k_00->cinfo == 0)) {
          for (uVar9 = 1; uVar9 < (uint)in_RDX[4]; uVar9 = uVar9 + 1) {
            j2k_write_coc((opj_j2k_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                          ,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
            j2k_write_qcc((opj_j2k_t *)CONCAT44(iVar2,iVar8),iVar7);
          }
          if (*(int *)(*(long *)&j2k_00[1].state + (long)iVar1 * 0x15e8 + 0x1a4) != 0) {
            j2k_write_poc(j2k_00);
          }
        }
        if (in_RCX != (undefined8 *)0x0) {
          iVar4 = cio_tell(in_RSI);
          *(int *)(*(long *)(in_RCX[0xd] + (long)*(int *)((long)in_RDI + 0xc) * 0x260 + 600) +
                   (long)*(int *)((long)in_RDI + 0x14) * 0x14 + 4) =
               iVar4 + *(int *)(in_RDI + 7) + 1;
        }
        j2k_write_sod((opj_j2k_t *)image,cstr_info);
        if (in_RCX != (undefined8 *)0x0) {
          iVar4 = cio_tell(in_RSI);
          *(int *)(*(long *)(in_RCX[0xd] + (long)*(int *)((long)in_RDI + 0xc) * 0x260 + 600) +
                   (long)*(int *)((long)in_RDI + 0x14) * 0x14 + 8) =
               iVar4 + *(int *)(in_RDI + 7) + -1;
          *(int *)(*(long *)(in_RCX[0xd] + (long)*(int *)((long)in_RDI + 0xc) * 0x260 + 600) +
                   (long)*(int *)((long)in_RDI + 0x14) * 0x14 + 0xc) = iVar7;
          *(int *)(*(long *)(in_RCX[0xd] + (long)*(int *)((long)in_RDI + 0xc) * 0x260 + 600) +
                   (long)*(int *)((long)in_RDI + 0x14) * 0x14 + 0x10) = *(int *)(in_RCX + 1) - iVar7
          ;
          iVar7 = *(int *)(in_RCX + 1);
        }
        *(int *)((long)in_RDI + 0x14) = *(int *)((long)in_RDI + 0x14) + 1;
      }
    }
    if (in_RCX != (undefined8 *)0x0) {
      iVar7 = cio_tell(in_RSI);
      *(int *)(in_RCX[0xd] + (long)*(int *)((long)in_RDI + 0xc) * 0x260 + 0x14) =
           iVar7 + *(int *)(in_RDI + 7) + -1;
    }
  }
  tcd_free_encode((opj_tcd_t *)j2k_00);
  tcd_destroy((opj_tcd_t *)0x2b18a1);
  free((void *)in_RDI[3]);
  j2k_write_eoc(in_stack_ffffffffffffffa0);
  if (in_RCX != (undefined8 *)0x0) {
    iVar1 = cio_tell(in_RSI);
    *(int *)((long)in_RCX + 100) = iVar1 + *(int *)(in_RDI + 7);
    *(int *)((long)in_RCX + 100) = *(int *)((long)in_RCX + 100) - *(int *)((long)in_RCX + 0x5c);
  }
  return 1;
}

Assistant:

opj_bool j2k_encode(opj_j2k_t *j2k, opj_cio_t *cio, opj_image_t *image, opj_codestream_info_t *cstr_info) {
	int tileno, compno;
	opj_cp_t *cp = NULL;

	opj_tcd_t *tcd = NULL;	/* TCD component */

	j2k->cio = cio;	
	j2k->image = image;

	cp = j2k->cp;

	/* INDEX >> */
	j2k->cstr_info = cstr_info;
	if (cstr_info) {
		int compno;
		cstr_info->tile = (opj_tile_info_t *) opj_malloc(cp->tw * cp->th * sizeof(opj_tile_info_t));
		cstr_info->image_w = image->x1 - image->x0;
		cstr_info->image_h = image->y1 - image->y0;
		cstr_info->prog = (&cp->tcps[0])->prg;
		cstr_info->tw = cp->tw;
		cstr_info->th = cp->th;
		cstr_info->tile_x = cp->tdx;	/* new version parser */
		cstr_info->tile_y = cp->tdy;	/* new version parser */
		cstr_info->tile_Ox = cp->tx0;	/* new version parser */
		cstr_info->tile_Oy = cp->ty0;	/* new version parser */
		cstr_info->numcomps = image->numcomps;
		cstr_info->numlayers = (&cp->tcps[0])->numlayers;
		cstr_info->numdecompos = (int*) opj_malloc(image->numcomps * sizeof(int));
		for (compno=0; compno < image->numcomps; compno++) {
			cstr_info->numdecompos[compno] = (&cp->tcps[0])->tccps->numresolutions - 1;
		}
		cstr_info->D_max = 0.0;		/* ADD Marcela */
		cstr_info->main_head_start = cio_tell(cio); /* position of SOC */
		cstr_info->maxmarknum = 100;
		cstr_info->marker = (opj_marker_info_t *) opj_malloc(cstr_info->maxmarknum * sizeof(opj_marker_info_t));
		cstr_info->marknum = 0;
	}
	/* << INDEX */

	j2k_write_soc(j2k);
	j2k_write_siz(j2k);
	j2k_write_cod(j2k);
	j2k_write_qcd(j2k);

	if(cp->cinema){
		for (compno = 1; compno < image->numcomps; compno++) {
			j2k_write_coc(j2k, compno);
			j2k_write_qcc(j2k, compno);
		}
	}

	for (compno = 0; compno < image->numcomps; compno++) {
		opj_tcp_t *tcp = &cp->tcps[0];
		if (tcp->tccps[compno].roishift)
			j2k_write_rgn(j2k, compno, 0);
	}
	if (cp->comment != NULL) {
		j2k_write_com(j2k);
	}

	j2k->totnum_tp = j2k_calculate_tp(cp,image->numcomps,image,j2k);
	/* TLM Marker*/
	if(cp->cinema){
		j2k_write_tlm(j2k);
		if (cp->cinema == CINEMA4K_24) {
			j2k_write_poc(j2k);
		}
	}

	/* uncomment only for testing JPSEC marker writing */
	/* j2k_write_sec(j2k); */

	/* INDEX >> */
	if(cstr_info) {
		cstr_info->main_head_end = cio_tell(cio) - 1;
	}
	/* << INDEX */
	/**** Main Header ENDS here ***/

	/* create the tile encoder */
	tcd = tcd_create(j2k->cinfo);

	/* encode each tile */
	for (tileno = 0; tileno < cp->tw * cp->th; tileno++) {
		int pino;
		int tilepartno=0;
		/* UniPG>> */
		int acc_pack_num = 0;
		/* <<UniPG */


		opj_tcp_t *tcp = &cp->tcps[tileno];
		opj_event_msg(j2k->cinfo, EVT_INFO, "tile number %d / %d\n", tileno + 1, cp->tw * cp->th);

		j2k->curtileno = tileno;
		j2k->cur_tp_num = 0;
		tcd->cur_totnum_tp = j2k->cur_totnum_tp[j2k->curtileno];
		/* initialisation before tile encoding  */
		if (tileno == 0) {
			tcd_malloc_encode(tcd, image, cp, j2k->curtileno);
		} else {
			tcd_init_encode(tcd, image, cp, j2k->curtileno);
		}

		/* INDEX >> */
		if(cstr_info) {
			cstr_info->tile[j2k->curtileno].start_pos = cio_tell(cio) + j2k->pos_correction;
			cstr_info->tile[j2k->curtileno].maxmarknum = 10;
			cstr_info->tile[j2k->curtileno].marker = (opj_marker_info_t *) opj_malloc(cstr_info->tile[j2k->curtileno].maxmarknum * sizeof(opj_marker_info_t));
			cstr_info->tile[j2k->curtileno].marknum = 0;
		}
		/* << INDEX */

		for(pino = 0; pino <= tcp->numpocs; pino++) {
			int tot_num_tp;
			tcd->cur_pino=pino;

			/*Get number of tile parts*/
			tot_num_tp = j2k_get_num_tp(cp,pino,tileno);
			tcd->tp_pos = cp->tp_pos;

			for(tilepartno = 0; tilepartno < tot_num_tp ; tilepartno++){
				j2k->tp_num = tilepartno;
				/* INDEX >> */
				if(cstr_info)
					cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_start_pos =
					cio_tell(cio) + j2k->pos_correction;
				/* << INDEX */
				j2k_write_sot(j2k);

				if(j2k->cur_tp_num == 0 && cp->cinema == 0){
					for (compno = 1; compno < image->numcomps; compno++) {
						j2k_write_coc(j2k, compno);
						j2k_write_qcc(j2k, compno);
					}
					if (cp->tcps[tileno].numpocs) {
						j2k_write_poc(j2k);
					}
				}

				/* INDEX >> */
				if(cstr_info)
					cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_end_header =
					cio_tell(cio) + j2k->pos_correction + 1;
				/* << INDEX */

				j2k_write_sod(j2k, tcd);

				/* INDEX >> */
				if(cstr_info) {
					cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_end_pos =
						cio_tell(cio) + j2k->pos_correction - 1;
					cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_start_pack =
						acc_pack_num;
					cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_numpacks =
						cstr_info->packno - acc_pack_num;
					acc_pack_num = cstr_info->packno;
				}
				/* << INDEX */

				j2k->cur_tp_num++;
			}			
		}
		if(cstr_info) {
			cstr_info->tile[j2k->curtileno].end_pos = cio_tell(cio) + j2k->pos_correction - 1;
		}


		/*
		if (tile->PPT) { // BAD PPT !!! 
		FILE *PPT_file;
		int i;
		PPT_file=fopen("PPT","rb");
		fprintf(stderr,"%c%c%c%c",255,97,tile->len_ppt/256,tile->len_ppt%256);
		for (i=0;i<tile->len_ppt;i++) {
		unsigned char elmt;
		fread(&elmt, 1, 1, PPT_file);
		fwrite(&elmt,1,1,f);
		}
		fclose(PPT_file);
		unlink("PPT");
		}
		*/

	}

	/* destroy the tile encoder */
	tcd_free_encode(tcd);
	tcd_destroy(tcd);

	opj_free(j2k->cur_totnum_tp);

	j2k_write_eoc(j2k);

	if(cstr_info) {
		cstr_info->codestream_size = cio_tell(cio) + j2k->pos_correction;
		/* UniPG>> */
		/* The following adjustment is done to adjust the codestream size */
		/* if SOD is not at 0 in the buffer. Useful in case of JP2, where */
		/* the first bunch of bytes is not in the codestream              */
		cstr_info->codestream_size -= cstr_info->main_head_start;
		/* <<UniPG */
	}

#ifdef USE_JPWL
	/*
	preparation of JPWL marker segments
	*/
	if(cp->epc_on) {

		/* encode according to JPWL */
		jpwl_encode(j2k, cio, image);

	}
#endif /* USE_JPWL */

	return OPJ_TRUE;
}